

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VListNameToNum(VList *pIn,char *zName,int nName)

{
  int iVar1;
  int iVar2;
  char *__s1;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  char *z;
  int mx;
  int i;
  int local_20;
  
  if (in_RDI != 0) {
    iVar1 = *(int *)(in_RDI + 4);
    local_20 = 2;
    do {
      __s1 = (char *)(in_RDI + (long)(local_20 + 2) * 4);
      iVar2 = strncmp(__s1,in_RSI,(long)in_EDX);
      if ((iVar2 == 0) && (__s1[in_EDX] == '\0')) {
        return *(int *)(in_RDI + (long)local_20 * 4);
      }
      local_20 = *(int *)(in_RDI + (long)(local_20 + 1) * 4) + local_20;
    } while (local_20 < iVar1);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VListNameToNum(VList *pIn, const char *zName, int nName){
  int i, mx;
  if( pIn==0 ) return 0;
  mx = pIn[1];
  i = 2;
  do{
    const char *z = (const char*)&pIn[i+2];
    if( strncmp(z,zName,nName)==0 && z[nName]==0 ) return pIn[i];
    i += pIn[i+1];
  }while( i<mx );
  return 0;
}